

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::removeItem
          (QGraphicsSceneBspTreeIndexPrivate *this,QGraphicsItem *item,bool recursive,
          bool moveToUnindexedItems)

{
  int iVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsItem *item_00;
  pointer ppQVar3;
  QList<QGraphicsItem_*> *c;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  QRectF local_60;
  QGraphicsItem *item_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  item_local = item;
  if (item == (QGraphicsItem *)0x0) goto LAB_005b2e19;
  iVar1 = ((item->d_ptr).d)->index;
  if (iVar1 == -1) {
    c = &this->unindexedItems;
LAB_005b2db4:
    QtPrivate::sequential_erase_one<QList<QGraphicsItem*>,QGraphicsItem*>(c,&item_local);
  }
  else {
    QList<int>::append(&this->freeItemIndexes,iVar1);
    iVar1 = ((item->d_ptr).d)->index;
    ppQVar3 = QList<QGraphicsItem_*>::data(&this->indexedItems);
    item_00 = item_local;
    ppQVar3[iVar1] = (QGraphicsItem *)0x0;
    pQVar2 = (item_local->d_ptr).d;
    pQVar2->index = -1;
    uVar4 = *(ulong *)&pQVar2->field_0x160;
    if ((uVar4 & 0x2000040000) != 0) {
      c = &this->untransformableItems;
      goto LAB_005b2db4;
    }
    if ((uVar4 >> 0x37 & 1) == 0) {
      if ((uVar4 & 0x120000) == 0) {
        QGraphicsItemPrivate::sceneEffectiveBoundingRect(&local_60,pQVar2);
        QGraphicsSceneBspTree::removeItem(&this->bsp,item_00,&local_60);
      }
    }
    else {
      this->purgePending = true;
      QSet<QGraphicsItem_*>::operator<<(&this->removedItems,&item_local);
    }
  }
  invalidateSortCache(this);
  if (moveToUnindexedItems) {
    addItem(this,item_local,false);
  }
  if (recursive) {
    for (uVar4 = 0; pQVar2 = (item_local->d_ptr).d, uVar4 < (ulong)(pQVar2->children).d.size;
        uVar4 = uVar4 + 1) {
      removeItem(this,(pQVar2->children).d.ptr[uVar4],true,moveToUnindexedItems);
    }
  }
LAB_005b2e19:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::removeItem(QGraphicsItem *item, bool recursive,
                                                   bool moveToUnindexedItems)
{
    if (!item)
        return;

    if (item->d_ptr->index != -1) {
        Q_ASSERT(item->d_ptr->index < indexedItems.size());
        Q_ASSERT(indexedItems.at(item->d_ptr->index) == item);
        Q_ASSERT(!item->d_ptr->itemDiscovered);
        freeItemIndexes << item->d_ptr->index;
        indexedItems[item->d_ptr->index] = 0;
        item->d_ptr->index = -1;

        if (item->d_ptr->itemIsUntransformable()) {
            untransformableItems.removeOne(item);
        } else if (item->d_ptr->inDestructor) {
            // Avoid virtual function calls from the destructor.
            purgePending = true;
            removedItems << item;
        } else if (!(item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
                     || item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren)) {
            bsp.removeItem(item, item->d_ptr->sceneEffectiveBoundingRect());
        }
    } else {
        unindexedItems.removeOne(item);
    }
    invalidateSortCache(); // ### Only do this when removing from BSP?

    Q_ASSERT(item->d_ptr->index == -1);
    Q_ASSERT(!indexedItems.contains(item));
    Q_ASSERT(!unindexedItems.contains(item));
    Q_ASSERT(!untransformableItems.contains(item));

    if (moveToUnindexedItems)
        addItem(item);

    if (recursive) {
        for (int i = 0; i < item->d_ptr->children.size(); ++i)
            removeItem(item->d_ptr->children.at(i), recursive, moveToUnindexedItems);
    }
}